

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugTextEncoding(char *str)

{
  bool bVar1;
  ImFont *this;
  ImFontGlyph *pIVar2;
  char *in_text;
  char *in_RDI;
  ImGuiID unaff_retaddr;
  float in_stack_00000008;
  ImGuiTableColumnFlags in_stack_0000000c;
  char *in_stack_00000010;
  int byte_index;
  int c_utf8_len;
  uint c;
  char *p;
  undefined4 in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  ImGuiTableFlags in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int iVar3;
  int in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  ImVec2 in_stack_fffffffffffffff0;
  
  Text("Text: \"%s\"",in_RDI);
  ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffff0,0.0,0.0);
  bVar1 = BeginTable((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,
                     (ImVec2 *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    TableSetupColumn(in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr);
    TableSetupColumn(in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr);
    TableSetupColumn(in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr);
    TableSetupColumn(in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr);
    TableHeadersRow();
    for (in_text = in_RDI; *in_text != '\0'; in_text = in_text + in_stack_ffffffffffffffe0) {
      in_stack_ffffffffffffffe0 =
           ImTextCharFromUtf8((uint *)in_stack_fffffffffffffff0,in_text,
                              (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0))
      ;
      TableNextColumn();
      Text("%d",(ulong)(uint)((int)in_text - (int)in_RDI));
      TableNextColumn();
      for (iVar3 = 0; iVar3 < in_stack_ffffffffffffffe0; iVar3 = iVar3 + 1) {
        if (0 < iVar3) {
          SameLine(0.0,-1.0);
        }
        Text("0x%02X",(ulong)(byte)in_text[iVar3]);
      }
      TableNextColumn();
      this = GetFont();
      pIVar2 = ImFont::FindGlyphNoFallback(this,(ImWchar)in_stack_ffffffffffffffe4);
      if (pIVar2 == (ImFontGlyph *)0x0) {
        if (in_stack_ffffffffffffffe4 == 0xfffd) {
          in_stack_ffffffffffffffd0 = "[invalid]";
        }
        else {
          in_stack_ffffffffffffffd0 = "[missing]";
        }
        TextUnformatted(in_stack_ffffffffffffffd0,
                        (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      }
      else {
        TextUnformatted(in_stack_ffffffffffffffd0,
                        (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      }
      TableNextColumn();
      Text("U+%04X",(ulong)in_stack_ffffffffffffffe4);
    }
    EndTable();
  }
  return;
}

Assistant:

void ImGui::DebugTextEncoding(const char* str)
{
    Text("Text: \"%s\"", str);
    if (!BeginTable("list", 4, ImGuiTableFlags_Borders | ImGuiTableFlags_RowBg | ImGuiTableFlags_SizingFixedFit))
        return;
    TableSetupColumn("Offset");
    TableSetupColumn("UTF-8");
    TableSetupColumn("Glyph");
    TableSetupColumn("Codepoint");
    TableHeadersRow();
    for (const char* p = str; *p != 0; )
    {
        unsigned int c;
        const int c_utf8_len = ImTextCharFromUtf8(&c, p, NULL);
        TableNextColumn();
        Text("%d", (int)(p - str));
        TableNextColumn();
        for (int byte_index = 0; byte_index < c_utf8_len; byte_index++)
        {
            if (byte_index > 0)
                SameLine();
            Text("0x%02X", (int)(unsigned char)p[byte_index]);
        }
        TableNextColumn();
        if (GetFont()->FindGlyphNoFallback((ImWchar)c))
            TextUnformatted(p, p + c_utf8_len);
        else
            TextUnformatted((c == IM_UNICODE_CODEPOINT_INVALID) ? "[invalid]" : "[missing]");
        TableNextColumn();
        Text("U+%04X", (int)c);
        p += c_utf8_len;
    }
    EndTable();
}